

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QHash<QStyle::SubControl,_QRect> __thiscall
QStyleSheetStyle::titleBarLayout(QStyleSheetStyle *this,QWidget *w,QStyleOptionTitleBar *tb)

{
  QPainterPath *this_00;
  uint uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  Data *pDVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  undefined1 auVar9 [8];
  QHash<QString,_QVariant> QVar10;
  QSharedDataPointer<QStyleSheetPaletteData> QVar11;
  QSharedDataPointer<QStyleSheetBoxData> QVar12;
  QSharedDataPointer<QStyleSheetBackgroundData> QVar13;
  QSharedDataPointer<QStyleSheetBorderData> QVar14;
  QSharedDataPointer<QStyleSheetOutlineData> QVar15;
  QSharedDataPointer<QStyleSheetGeometryData> QVar16;
  QSharedDataPointer<QStyleSheetPositionData> QVar17;
  QSharedDataPointer<QStyleSheetImageData> QVar18;
  QSharedDataPointer<QStyleSheetPositionData> QVar19;
  QSharedDataPointer<QStyleSheetImageData> QVar20;
  int iVar21;
  ButtonInfo *pBVar22;
  QStyleSheetGeometryData *ptr;
  ulong uVar23;
  QSize QVar24;
  ButtonInfo *pBVar25;
  int iVar26;
  QStyleOption *in_RCX;
  undefined1 *puVar27;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *pQVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  ButtonInfo *info;
  QVariant *pQVar32;
  long lVar33;
  long lVar34;
  ButtonInfo *tmp;
  QBrush *pQVar35;
  long in_FS_OFFSET;
  QByteArrayView layout;
  QRect QVar36;
  QRect QVar37;
  SubControl control;
  QArrayData *d;
  QRenderRule subRule;
  int offsets [3];
  Representation local_280;
  SubControl local_24c;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> local_248;
  QArrayDataPointer<QVariant> local_228;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined1 *local_1f8 [2];
  bool local_1e8;
  QHash<QString,_QVariant> local_1e0;
  QSharedDataPointer<QStyleSheetPaletteData> QStack_1d8;
  QSharedDataPointer<QStyleSheetBoxData> local_1d0;
  QSharedDataPointer<QStyleSheetBackgroundData> QStack_1c8;
  QSharedDataPointer<QStyleSheetBorderData> local_1c0;
  QSharedDataPointer<QStyleSheetOutlineData> QStack_1b8;
  QSharedDataPointer<QStyleSheetGeometryData> local_1b0;
  QSharedDataPointer<QStyleSheetPositionData> QStack_1a8;
  QSharedDataPointer<QStyleSheetImageData> local_1a0;
  QSharedDataPointer<QStyleSheetPositionData> QStack_198;
  int local_190;
  QPainterPath aQStack_188 [8];
  int local_180;
  int iStack_17c;
  uint uStack_178;
  int iStack_174;
  QRenderRule local_170;
  undefined8 local_e8;
  int local_e0;
  undefined1 local_d8 [16];
  QFont local_c8 [16];
  bool local_b8;
  QHash<QString,_QVariant> local_b0;
  QSharedDataPointer<QStyleSheetPaletteData> QStack_a8;
  QSharedDataPointer<QStyleSheetBoxData> local_a0;
  QSharedDataPointer<QStyleSheetBackgroundData> QStack_98;
  QSharedDataPointer<QStyleSheetBorderData> local_90;
  QSharedDataPointer<QStyleSheetOutlineData> QStack_88;
  QSharedDataPointer<QStyleSheetGeometryData> local_80;
  QSharedDataPointer<QStyleSheetPositionData> QStack_78;
  QSharedDataPointer<QStyleSheetImageData> local_70;
  QSharedDataPointer<QStyleSheetImageData> QStack_68;
  int local_60;
  QPainterPath local_58 [8];
  undefined8 local_50;
  undefined8 uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0;
  uVar1 = *(uint *)&in_RCX[1].palette.d;
  memset(&local_170,0xaa,0x88);
  renderRule(&local_170,(QStyleSheetStyle *)w,(QObject *)tb,in_RCX,0);
  QVar36 = QRenderRule::contentsRect(&local_170,&in_RCX->rect);
  local_228.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_228.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_228.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_208 = (undefined1  [8])0xd;
  uStack_200 = "button-layout";
  QHash<QString,_QVariant>::value<QLatin1String,_true>
            ((QVariant *)local_d8,&local_170.styleHints,(QLatin1String *)local_208);
  ::QVariant::toList();
  ::QVariant::~QVariant((QVariant *)local_d8);
  if ((undefined1 *)local_228.size == (undefined1 *)0x0) {
    layout.m_data = "I(T)HSmMX";
    layout.m_size = 9;
    subControlLayout((QList<QVariant> *)local_208,layout);
    puVar27 = local_1f8[0];
    pQVar32 = (QVariant *)uStack_200;
    auVar9 = local_208;
    qVar7 = local_228.size;
    local_d8._8_8_ = local_228.ptr;
    local_d8._0_8_ = local_228.d;
    local_208 = (undefined1  [8])0x0;
    uStack_200 = (char *)0x0;
    local_1f8[0] = (undefined1 *)0x0;
    local_228.d = (Data *)auVar9;
    local_228.ptr = pQVar32;
    local_228.size = (qsizetype)puVar27;
    qVar8 = local_228.size;
    local_228.size._0_1_ = (undefined1)qVar7;
    local_228.size._1_1_ = SUB81(qVar7,1);
    local_228.size._2_1_ = SUB81(qVar7,2);
    local_228.size._3_1_ = SUB81(qVar7,3);
    local_228.size._4_1_ = SUB81(qVar7,4);
    local_228.size._5_1_ = SUB81(qVar7,5);
    local_228.size._6_1_ = SUB81(qVar7,6);
    local_228.size._7_1_ = SUB81(qVar7,7);
    local_c8[0] = (QFont)(undefined1)local_228.size;
    local_c8[1] = (QFont)local_228.size._1_1_;
    local_c8[2] = (QFont)local_228.size._2_1_;
    local_c8[3] = (QFont)local_228.size._3_1_;
    local_c8[4] = (QFont)local_228.size._4_1_;
    local_c8[5] = (QFont)local_228.size._5_1_;
    local_c8[6] = (QFont)local_228.size._6_1_;
    local_c8[7] = (QFont)local_228.size._7_1_;
    local_228.size = qVar8;
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_d8);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_208);
  }
  local_e8 = 0;
  local_e0 = 0;
  local_248.d = (Data *)0x0;
  local_248.ptr = (ButtonInfo *)0x0;
  local_248.size = 0;
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puVar27 = (undefined1 *)local_228.size;
  if (local_228.size < 1) {
    puVar27 = (undefined1 *)0x0;
  }
  local_208 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  pBVar22 = (ButtonInfo *)
            QArrayData::allocate((QArrayData **)local_208,0x98,0x10,(longlong)puVar27,KeepSize);
  if (local_208 != (undefined1  [8])0x0) {
    *(byte *)&(((ArrayOptions *)((long)local_208 + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_208 + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_248.d = (Data *)local_208;
  local_d8._0_8_ = (PrivateShared *)0x0;
  local_d8._8_8_ = local_248.ptr;
  local_248.size = 0;
  local_c8[0] = (QFont)0x0;
  local_c8[1] = (QFont)0x0;
  local_c8[2] = (QFont)0x0;
  local_c8[3] = (QFont)0x0;
  local_c8[4] = (QFont)0x0;
  local_c8[5] = (QFont)0x0;
  local_c8[6] = (QFont)0x0;
  local_c8[7] = (QFont)0x0;
  local_248.ptr = pBVar22;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer
            ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)local_d8);
  if ((undefined1 *)local_228.size != (undefined1 *)0x0) {
    lVar34 = local_228.size << 5;
    uVar5 = 0;
    pQVar32 = local_228.ptr;
    do {
      iVar21 = ::QVariant::toInt((bool *)pQVar32);
      if (iVar21 == 0x28) {
        uVar5 = 2;
        goto LAB_003540d6;
      }
      if (iVar21 == 0x29) {
        uVar5 = 1;
        goto LAB_003540d6;
      }
      memset((QRenderRule *)local_208,0xaa,0x98);
      QRenderRule::QRenderRule((QRenderRule *)local_208);
      local_180 = iVar21;
      switch(iVar21) {
      case 0x41:
        bVar3 = *(byte *)((long)&in_RCX[1].palette.d + 5) & 0x30;
        goto joined_r0x003535bb;
      case 0x42:
      case 0x49:
        bVar3 = *(byte *)((long)&in_RCX[1].palette.d + 5) & 0x20;
        goto joined_r0x003535bb;
      case 0x43:
        if (((ulong)in_RCX[1].palette.d & 0x400000000000) == 0) break;
        iVar21 = 0x47;
LAB_003535e6:
        uVar4 = uVar1 & 1;
joined_r0x00353846:
        if (uVar4 != 0) {
          local_180 = iVar21;
        }
        goto LAB_003535f4;
      case 0x44:
        if (((ulong)in_RCX[1].palette.d & 0x800000000000) != 0) {
          iVar21 = 0x47;
          uVar4 = uVar1 & 2;
          goto joined_r0x00353846;
        }
        break;
      case 0x45:
        if (((ulong)in_RCX[1].palette.d & 0x2000000000000) != 0) {
          iVar21 = 0x46;
          goto LAB_003535e6;
        }
        break;
      case 0x48:
        bVar3 = *(byte *)((long)&in_RCX[1].palette.d + 6) & 1;
joined_r0x003535bb:
        if (bVar3 == 0) break;
LAB_003535f4:
        if (local_180 == 0x41) {
          iVar21 = QFontMetrics::horizontalAdvance
                             ((QString *)&in_RCX->fontMetrics,(int)in_RCX + 0x48);
          iStack_174 = iVar21 + 6;
          ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
          iVar29 = QFontMetrics::height();
          ptr->super_QSharedData = (QAtomicInt)0x0;
          ptr->minWidth = -1;
          ptr->minHeight = -1;
          ptr->width = iVar21 + 6;
          ptr->height = iVar29;
          ptr->maxWidth = -1;
          ptr->maxHeight = -1;
          QSharedDataPointer<QStyleSheetGeometryData>::reset(&local_170.geo,ptr);
        }
        else {
          renderRule((QRenderRule *)local_d8,(QStyleSheetStyle *)w,(QObject *)tb,in_RCX,local_180);
          QRenderRule::operator=(&local_170,(QRenderRule *)local_d8);
          QPainterPath::~QPainterPath(local_58);
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&QStack_68);
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_70);
          if (QStack_78.d.ptr != (QStyleSheetPositionData *)0x0) {
            LOCK();
            *(int *)QStack_78.d.ptr = *(int *)QStack_78.d.ptr + -1;
            UNLOCK();
            if ((*(int *)QStack_78.d.ptr == 0) &&
               (QStack_78.d.ptr != (QStyleSheetPositionData *)0x0)) {
              operator_delete((void *)QStack_78.d.ptr,0x24);
            }
          }
          if (local_80.d.ptr != (QStyleSheetGeometryData *)0x0) {
            LOCK();
            *(int *)local_80.d.ptr = *(int *)local_80.d.ptr + -1;
            UNLOCK();
            if ((*(int *)local_80.d.ptr == 0) && (local_80.d.ptr != (QStyleSheetGeometryData *)0x0))
            {
              operator_delete((void *)local_80.d.ptr,0x1c);
            }
          }
          QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&QStack_88);
          QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_90);
          QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&QStack_98);
          if (local_a0.d.ptr != (QStyleSheetBoxData *)0x0) {
            LOCK();
            *(int *)local_a0.d.ptr = *(int *)local_a0.d.ptr + -1;
            UNLOCK();
            if ((*(int *)local_a0.d.ptr == 0) && (local_a0.d.ptr != (QStyleSheetBoxData *)0x0)) {
              operator_delete((void *)local_a0.d.ptr,0x28);
            }
          }
          QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&QStack_a8);
          QHash<QString,_QVariant>::~QHash(&local_b0);
          QFont::~QFont(local_c8);
          QBrush::~QBrush((QBrush *)(local_d8 + 8));
          if (local_170.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
            uVar23 = 0xffffffff;
            if ((local_170.img.d.ptr == (QStyleSheetImageData *)0x0) ||
               ((((QSize *)((long)local_170.img.d.ptr + 0x14))->wd).m_i < 0)) {
              QVar24.wd.m_i = -1;
              QVar24.ht.m_i = 0;
            }
            else {
              QVar24.wd.m_i = -1;
              QVar24.ht.m_i = 0;
              if (-1 < ((Representation *)((long)local_170.img.d.ptr + 0x18))->m_i) {
                QVar24 = *(QSize *)((long)local_170.img.d.ptr + 0x14);
                uVar23 = (ulong)QVar24 >> 0x20;
              }
            }
          }
          else {
            QVar24.ht.m_i = 0;
            QVar24.wd.m_i = *(int *)((long)local_170.geo.d.ptr + 0xc);
            uVar23 = (ulong)(uint)*(int *)((long)local_170.geo.d.ptr + 0x10);
          }
          local_d8._0_8_ = (ulong)QVar24 & 0xffffffff | uVar23 << 0x20;
          QVar24 = QRenderRule::boxSize(&local_170,(QSize *)local_d8,7);
          iStack_174 = (int)QVar24.wd.m_i;
        }
        pQVar35 = (QBrush *)(local_208 + 8);
        QRenderRule::operator=((QRenderRule *)local_208,&local_170);
        qVar7 = local_248.size;
        pBVar22 = local_248.ptr;
        pDVar6 = local_248.d;
        iStack_17c = *(int *)((long)&local_e8 + (ulong)uVar5 * 4);
        pQVar28 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                  (ulong)(uint)(iStack_17c + iStack_174);
        *(int *)((long)&local_e8 + (ulong)uVar5 * 4) = iStack_17c + iStack_174;
        uStack_178 = uVar5;
        if ((&(local_248.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_248.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003538d8:
          memset(local_d8,0xaa,0x98);
          local_d8._0_4_ = local_208._0_4_;
          QBrush::QBrush((QBrush *)(local_d8 + 8),pQVar35);
          QFont::QFont(local_c8,(QFont *)local_1f8);
          QStack_68.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)
               (totally_ordered_wrapper<QStyleSheetImageData_*>)QStack_198.d.ptr;
          local_70.d.ptr = local_1a0.d.ptr;
          QStack_78.d.ptr = QStack_1a8.d.ptr;
          local_80.d.ptr = local_1b0.d.ptr;
          QStack_88.d.ptr = QStack_1b8.d.ptr;
          local_90.d.ptr = local_1c0.d.ptr;
          QStack_98.d.ptr = QStack_1c8.d.ptr;
          local_a0.d.ptr = local_1d0.d.ptr;
          QStack_a8.d.ptr = QStack_1d8.d.ptr;
          local_b0.d = local_1e0.d;
          local_b8 = local_1e8;
          local_1e0.d = (Data *)0x0;
          QStack_1d8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
          local_1d0.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0
          ;
          QStack_1c8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
               (QStyleSheetBackgroundData *)0x0;
          local_1c0.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
          QStack_1b8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
          local_1b0.d.ptr =
               (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
          QStack_1a8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
          local_1a0.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
          QStack_198.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
          local_60 = local_190;
          QPainterPath::QPainterPath(local_58,aQStack_188);
          local_50 = CONCAT44(iStack_17c,local_180);
          uStack_48 = CONCAT44(iStack_174,uStack_178);
          if ((&pDVar6->super_QArrayData == (QArrayData *)0x0) ||
             (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003539e9:
            QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
                      (&local_248,GrowsAtEnd,1,pQVar28);
            pBVar22 = local_248.ptr;
          }
          else {
            pQVar28 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                      ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
            pBVar22 = local_248.ptr;
            if ((*(qsizetype *)((long)pDVar6 + 8) - qVar7) +
                ((long)local_248.ptr - (long)pQVar28 >> 3) * 0x79435e50d79435e5 < 1) {
              lVar33 = (long)local_248.ptr - (long)pQVar28;
              if ((lVar33 < 1) ||
                 (pQVar28 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                            (*(qsizetype *)((long)pDVar6 + 8) * 2),
                 SBORROW8(qVar7 * 3,(long)pQVar28) ==
                 qVar7 * 3 + *(qsizetype *)((long)pDVar6 + 8) * -2 < 0)) goto LAB_003539e9;
              pBVar22 = (ButtonInfo *)((lVar33 >> 3) * -8 + (long)local_248.ptr);
              if (local_248.ptr != (ButtonInfo *)0x0 && qVar7 != 0) {
                memmove(pBVar22,local_248.ptr,qVar7 * 0x98);
              }
            }
          }
          local_248.ptr = pBVar22;
          pBVar22 = local_248.ptr;
          memmove(local_248.ptr + qVar7 + 1,local_248.ptr + qVar7,(local_248.size - qVar7) * 0x98);
          pBVar22[qVar7].rule.features = local_d8._0_4_;
          QBrush::QBrush(&pBVar22[qVar7].rule.defaultBackground,(QBrush *)(local_d8 + 8));
          QFont::QFont(&pBVar22[qVar7].rule.font,local_c8);
          QVar20.d.ptr = QStack_68.d.ptr;
          QVar18.d.ptr = local_70.d.ptr;
          QVar17.d.ptr = QStack_78.d.ptr;
          QVar16.d.ptr = local_80.d.ptr;
          QVar15.d.ptr = QStack_88.d.ptr;
          QVar14.d.ptr = local_90.d.ptr;
          QVar13.d.ptr = QStack_98.d.ptr;
          QVar12.d.ptr = local_a0.d.ptr;
          QVar11.d.ptr = QStack_a8.d.ptr;
          QVar10.d = local_b0.d;
          pBVar22[qVar7].rule.hasFont = local_b8;
          pQVar28 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x0;
          local_b0.d = (Data *)0x0;
          pBVar22[qVar7].rule.styleHints.d = QVar10.d;
          QStack_a8.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
          pBVar22[qVar7].rule.pal.d.ptr = (QStyleSheetPaletteData *)QVar11.d.ptr;
          local_a0.d.ptr = (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0;
          pBVar22[qVar7].rule.b.d.ptr = (QStyleSheetBoxData *)QVar12.d.ptr;
          QStack_98.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
               (QStyleSheetBackgroundData *)0x0;
          pBVar22[qVar7].rule.bg.d.ptr = (QStyleSheetBackgroundData *)QVar13.d.ptr;
          local_90.d.ptr =
               (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
          pBVar22[qVar7].rule.bd.d.ptr = (QStyleSheetBorderData *)QVar14.d.ptr;
          QStack_88.d.ptr =
               (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
          pBVar22[qVar7].rule.ou.d.ptr = (QStyleSheetOutlineData *)QVar15.d.ptr;
          local_80.d.ptr =
               (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
          pBVar22[qVar7].rule.geo.d.ptr = (QStyleSheetGeometryData *)QVar16.d.ptr;
          QStack_78.d.ptr =
               (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
          pBVar22[qVar7].rule.p.d.ptr = (QStyleSheetPositionData *)QVar17.d.ptr;
          local_70.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
          pBVar22[qVar7].rule.img.d.ptr = (QStyleSheetImageData *)QVar18.d.ptr;
          QStack_68.d.ptr =
               (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
          pBVar22[qVar7].rule.iconPtr.d.ptr = (QStyleSheetImageData *)QVar20.d.ptr;
          pBVar22[qVar7].rule.clipset = local_60;
          this_00 = &pBVar22[qVar7].rule.clipPath;
          QPainterPath::QPainterPath(this_00,local_58);
          *(undefined8 *)(this_00 + 8) = local_50;
          *(undefined8 *)(this_00 + 0x10) = uStack_48;
          local_248.size = local_248.size + 1;
          QPainterPath::~QPainterPath(local_58);
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&QStack_68);
          QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_70);
          if (QStack_78.d.ptr != (QStyleSheetPositionData *)0x0) {
            LOCK();
            *(int *)QStack_78.d.ptr = *(int *)QStack_78.d.ptr + -1;
            UNLOCK();
            if ((*(int *)QStack_78.d.ptr == 0) &&
               (QStack_78.d.ptr != (QStyleSheetPositionData *)0x0)) {
              operator_delete((void *)QStack_78.d.ptr,0x24);
            }
          }
          if (local_80.d.ptr != (QStyleSheetGeometryData *)0x0) {
            LOCK();
            *(int *)local_80.d.ptr = *(int *)local_80.d.ptr + -1;
            UNLOCK();
            if ((*(int *)local_80.d.ptr == 0) && (local_80.d.ptr != (QStyleSheetGeometryData *)0x0))
            {
              operator_delete((void *)local_80.d.ptr,0x1c);
            }
          }
          QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&QStack_88);
          QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_90);
          QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&QStack_98);
          if (local_a0.d.ptr != (QStyleSheetBoxData *)0x0) {
            LOCK();
            *(int *)local_a0.d.ptr = *(int *)local_a0.d.ptr + -1;
            UNLOCK();
            if ((*(int *)local_a0.d.ptr == 0) && (local_a0.d.ptr != (QStyleSheetBoxData *)0x0)) {
              operator_delete((void *)local_a0.d.ptr,0x28);
            }
          }
          QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&QStack_a8);
          QHash<QString,_QVariant>::~QHash(&local_b0);
          QFont::~QFont(local_c8);
          QBrush::~QBrush((QBrush *)(local_d8 + 8));
        }
        else {
          pBVar25 = (ButtonInfo *)
                    ((ulong)((long)&local_248.d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0
                    );
          lVar33 = *(qsizetype *)((long)local_248.d + 8) - local_248.size;
          if (lVar33 == ((long)local_248.ptr - (long)pBVar25 >> 3) * -0x79435e50d79435e5) {
            pQVar28 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                      CONCAT71((int7)((ulong)lVar33 >> 8),local_248.size != 0);
            if (pBVar25 == local_248.ptr || local_248.size != 0) goto LAB_003538d8;
            pBVar25 = local_248.ptr + -1;
            local_248.ptr[-1].rule.features = local_208._0_4_;
            QBrush::QBrush((QBrush *)&local_248.ptr[-1].rule.defaultBackground,pQVar35);
            QFont::QFont(&pBVar22[-1].rule.font,(QFont *)local_1f8);
            QVar19.d.ptr = QStack_198.d.ptr;
            QVar18.d.ptr = local_1a0.d.ptr;
            QVar17.d.ptr = QStack_1a8.d.ptr;
            QVar16.d.ptr = local_1b0.d.ptr;
            QVar15.d.ptr = QStack_1b8.d.ptr;
            QVar14.d.ptr = local_1c0.d.ptr;
            QVar13.d.ptr = QStack_1c8.d.ptr;
            QVar12.d.ptr = local_1d0.d.ptr;
            QVar11.d.ptr = QStack_1d8.d.ptr;
            QVar10.d = local_1e0.d;
            pBVar22[-1].rule.hasFont = local_1e8;
            pQVar28 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x0;
            local_1e0.d = (Data *)0x0;
            pBVar22[-1].rule.styleHints.d = QVar10.d;
            QStack_1d8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
            pBVar22[-1].rule.pal.d.ptr = (QStyleSheetPaletteData *)QVar11.d.ptr;
            local_1d0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0;
            pBVar22[-1].rule.b.d.ptr = (QStyleSheetBoxData *)QVar12.d.ptr;
            QStack_1c8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
                 (QStyleSheetBackgroundData *)0x0;
            pBVar22[-1].rule.bg.d.ptr = (QStyleSheetBackgroundData *)QVar13.d.ptr;
            local_1c0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
            pBVar22[-1].rule.bd.d.ptr = (QStyleSheetBorderData *)QVar14.d.ptr;
            QStack_1b8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
            pBVar22[-1].rule.ou.d.ptr = (QStyleSheetOutlineData *)QVar15.d.ptr;
            local_1b0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
            pBVar22[-1].rule.geo.d.ptr = (QStyleSheetGeometryData *)QVar16.d.ptr;
            QStack_1a8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
            pBVar22[-1].rule.p.d.ptr = (QStyleSheetPositionData *)QVar17.d.ptr;
            local_1a0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
            pBVar22[-1].rule.img.d.ptr = (QStyleSheetImageData *)QVar18.d.ptr;
            QStack_198.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
            pBVar22[-1].rule.iconPtr.d.ptr = (QStyleSheetImageData *)QVar19.d.ptr;
            pBVar22[-1].rule.clipset = local_190;
            QPainterPath::QPainterPath(&pBVar22[-1].rule.clipPath,aQStack_188);
            pBVar22[-1].element = local_180;
            pBVar22[-1].offset = iStack_17c;
            pBVar22[-1].where = uStack_178;
            pBVar22[-1].width = iStack_174;
            local_248.size = 1;
            local_248.ptr = pBVar25;
          }
          else {
            local_248.ptr[local_248.size].rule.features = local_208._0_4_;
            QBrush::QBrush(&local_248.ptr[local_248.size].rule.defaultBackground,pQVar35);
            QFont::QFont(&pBVar22[qVar7].rule.font,(QFont *)local_1f8);
            QVar19.d.ptr = QStack_198.d.ptr;
            QVar18.d.ptr = local_1a0.d.ptr;
            QVar17.d.ptr = QStack_1a8.d.ptr;
            QVar16.d.ptr = local_1b0.d.ptr;
            QVar15.d.ptr = QStack_1b8.d.ptr;
            QVar14.d.ptr = local_1c0.d.ptr;
            QVar13.d.ptr = QStack_1c8.d.ptr;
            QVar12.d.ptr = local_1d0.d.ptr;
            QVar11.d.ptr = QStack_1d8.d.ptr;
            QVar10.d = local_1e0.d;
            pBVar22[qVar7].rule.hasFont = local_1e8;
            pQVar28 = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x0;
            local_1e0.d = (Data *)0x0;
            pBVar22[qVar7].rule.styleHints.d = QVar10.d;
            QStack_1d8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPaletteData_*>)(QStyleSheetPaletteData *)0x0;
            pBVar22[qVar7].rule.pal.d.ptr = (QStyleSheetPaletteData *)QVar11.d.ptr;
            local_1d0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBoxData_*>)(QStyleSheetBoxData *)0x0;
            pBVar22[qVar7].rule.b.d.ptr = (QStyleSheetBoxData *)QVar12.d.ptr;
            QStack_1c8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBackgroundData_*>)
                 (QStyleSheetBackgroundData *)0x0;
            pBVar22[qVar7].rule.bg.d.ptr = (QStyleSheetBackgroundData *)QVar13.d.ptr;
            local_1c0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetBorderData_*>)(QStyleSheetBorderData *)0x0;
            pBVar22[qVar7].rule.bd.d.ptr = (QStyleSheetBorderData *)QVar14.d.ptr;
            QStack_1b8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetOutlineData_*>)(QStyleSheetOutlineData *)0x0;
            pBVar22[qVar7].rule.ou.d.ptr = (QStyleSheetOutlineData *)QVar15.d.ptr;
            local_1b0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetGeometryData_*>)(QStyleSheetGeometryData *)0x0;
            pBVar22[qVar7].rule.geo.d.ptr = (QStyleSheetGeometryData *)QVar16.d.ptr;
            QStack_1a8.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
            pBVar22[qVar7].rule.p.d.ptr = (QStyleSheetPositionData *)QVar17.d.ptr;
            local_1a0.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetImageData_*>)(QStyleSheetImageData *)0x0;
            pBVar22[qVar7].rule.img.d.ptr = (QStyleSheetImageData *)QVar18.d.ptr;
            QStack_198.d.ptr =
                 (totally_ordered_wrapper<QStyleSheetPositionData_*>)(QStyleSheetPositionData *)0x0;
            pBVar22[qVar7].rule.iconPtr.d.ptr = (QStyleSheetImageData *)QVar19.d.ptr;
            pBVar22[qVar7].rule.clipset = local_190;
            QPainterPath::QPainterPath(&pBVar22[qVar7].rule.clipPath,aQStack_188);
            pBVar22[qVar7].element = local_180;
            pBVar22[qVar7].offset = iStack_17c;
            pBVar22[qVar7].where = uStack_178;
            pBVar22[qVar7].width = iStack_174;
            local_248.size = qVar7 + 1;
          }
        }
        if ((&(local_248.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_248.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
                    (&local_248,GrowsAtEnd,0,pQVar28);
        }
        QPainterPath::~QPainterPath(aQStack_188);
        QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetImageData> *)&QStack_198);
        QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_1a0);
        goto joined_r0x00353801;
      }
      QPainterPath::~QPainterPath(aQStack_188);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                ((QSharedDataPointer<QStyleSheetImageData> *)&QStack_198);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_1a0);
joined_r0x00353801:
      if (QStack_1a8.d.ptr != (QStyleSheetPositionData *)0x0) {
        LOCK();
        (((QStyleSheetPositionData *)QStack_1a8.d.ptr)->super_QSharedData).ref.
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QStyleSheetPositionData *)QStack_1a8.d.ptr)->super_QSharedData).ref.
              super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type)
             (((QStyleSheetPositionData *)QStack_1a8.d.ptr)->super_QSharedData).ref.
             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int> == 0) && (QStack_1a8.d.ptr != (QStyleSheetPositionData *)0x0))
        {
          operator_delete((void *)QStack_1a8.d.ptr,0x24);
        }
      }
      if (local_1b0.d.ptr != (QStyleSheetGeometryData *)0x0) {
        LOCK();
        *(int *)local_1b0.d.ptr = *(int *)local_1b0.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_1b0.d.ptr == 0) && (local_1b0.d.ptr != (QStyleSheetGeometryData *)0x0)) {
          operator_delete((void *)local_1b0.d.ptr,0x1c);
        }
      }
      QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&QStack_1b8);
      QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_1c0);
      QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&QStack_1c8);
      if (local_1d0.d.ptr != (QStyleSheetBoxData *)0x0) {
        LOCK();
        *(int *)local_1d0.d.ptr = *(int *)local_1d0.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_1d0.d.ptr == 0) && (local_1d0.d.ptr != (QStyleSheetBoxData *)0x0)) {
          operator_delete((void *)local_1d0.d.ptr,0x28);
        }
      }
      QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&QStack_1d8);
      QHash<QString,_QVariant>::~QHash(&local_1e0);
      QFont::~QFont((QFont *)local_1f8);
      QBrush::~QBrush((QBrush *)(local_208 + 8));
LAB_003540d6:
      pQVar32 = pQVar32 + 1;
      lVar34 = lVar34 + -0x20;
    } while (lVar34 != 0);
  }
  if (local_248.size != 0) {
    iVar29 = QVar36.x2.m_i.m_i - local_e8._4_4_;
    local_280 = QVar36.x1.m_i;
    lVar34 = (long)iVar29 + (long)local_280.m_i + (long)(int)local_e8;
    iVar21 = local_e0 - (local_e0 + -1 >> 0x1f);
    lVar33 = local_248.size * 0x98;
    pBVar22 = local_248.ptr;
    do {
      iVar26 = pBVar22->where;
      local_208._4_4_ = QVar36.y1.m_i;
      uStack_200._4_4_ = QVar36.y2.m_i;
      if (iVar26 == 0) {
        iVar26 = local_280.m_i + pBVar22->offset;
        iVar30 = pBVar22->width + iVar26;
LAB_00354302:
        uStack_200 = (char *)CONCAT44(uStack_200._4_4_,iVar30 + -1);
        QVar37._8_8_ = uStack_200;
        QVar37.x1.m_i = iVar26;
        QVar37.y1.m_i = local_208._4_4_;
      }
      else {
        if (iVar26 == 1) {
          iVar26 = pBVar22->offset + iVar29 + 1;
          iVar30 = iVar26 + pBVar22->width;
          goto LAB_00354302;
        }
        QVar37 = QVar36;
        if (iVar26 == 2) {
          iVar26 = (int)((ulong)(((long)(int)local_208._4_4_ + (long)uStack_200._4_4_) -
                                ((long)(int)local_208._4_4_ + (long)uStack_200._4_4_ >> 0x3f)) >> 1)
                   - (uStack_200._4_4_ - local_208._4_4_) / 2;
          iVar30 = pBVar22->offset +
                   ((int)((ulong)(lVar34 - (lVar34 >> 0x3f)) >> 1) - (iVar21 + -1 >> 1));
          uStack_200 = (char *)CONCAT44((uStack_200._4_4_ - local_208._4_4_) + iVar26,
                                        pBVar22->width + iVar30 + -1);
          QVar37._8_8_ = uStack_200;
          QVar37.x1.m_i = iVar30;
          QVar37.y1.m_i = iVar26;
        }
      }
      local_24c = knownPseudoElements[pBVar22->element].subControl;
      _local_208 = QVar37;
      QVar37 = positionRect((QStyleSheetStyle *)w,(QWidget *)tb,&pBVar22->rule,pBVar22->element,
                            (QRect *)local_208,in_RCX->direction);
      QHash<QStyle::SubControl,QRect>::tryEmplace_impl<QStyle::SubControl_const&>
                ((TryEmplaceResult *)local_d8,this,&local_24c);
      lVar31 = ((ulong)local_d8._8_8_ >> 7) * 0x90;
      lVar2 = *(long *)(*(long *)(local_d8._0_8_ + 0x20) + 0x80 + lVar31);
      uVar23 = (ulong)*(byte *)((ulong)((uint)local_d8._8_8_ & 0x7f) +
                               *(long *)(local_d8._0_8_ + 0x20) + lVar31);
      *(long *)(lVar2 + 4 + uVar23 * 0x14) = QVar37._0_8_;
      *(long *)(lVar2 + 0xc + uVar23 * 0x14) = QVar37._8_8_;
      pBVar22 = pBVar22 + 1;
      lVar33 = lVar33 + -0x98;
    } while (lVar33 != 0);
  }
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer(&local_248);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_228);
  QPainterPath::~QPainterPath(&local_170.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_170.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_170.img);
  if (local_170.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_170.p.d.ptr = *(int *)local_170.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_170.p.d.ptr == 0) && (local_170.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_170.p.d.ptr,0x24);
    }
  }
  if (local_170.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_170.geo.d.ptr = *(int *)local_170.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_170.geo.d.ptr == 0) &&
       (local_170.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
      operator_delete((void *)local_170.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_170.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_170.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_170.bg);
  if (local_170.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_170.b.d.ptr = *(int *)local_170.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_170.b.d.ptr == 0) && (local_170.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_170.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_170.pal);
  QHash<QString,_QVariant>::~QHash(&local_170.styleHints);
  QFont::~QFont(&local_170.font);
  QBrush::~QBrush(&local_170.defaultBackground);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QHash<QStyle::SubControl,_QRect>)(Data *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHash<QStyle::SubControl, QRect> QStyleSheetStyle::titleBarLayout(const QWidget *w, const QStyleOptionTitleBar *tb) const
{
    QHash<QStyle::SubControl, QRect> layoutRects;
    const bool isMinimized = tb->titleBarState & Qt::WindowMinimized;
    const bool isMaximized = tb->titleBarState & Qt::WindowMaximized;
    QRenderRule subRule = renderRule(w, tb);
    QRect cr = subRule.contentsRect(tb->rect);
    QList<QVariant> layout = subRule.styleHint("button-layout"_L1).toList();
    if (layout.isEmpty())
        layout = subControlLayout("I(T)HSmMX"_L1);

    int offsets[3] = { 0, 0, 0 };
    enum Where { Left, Right, Center, NoWhere } where = Left;
    QList<ButtonInfo> infos;
    infos.reserve(layout.size());
    for (const QVariant &val : std::as_const(layout)) {
        const int element = val.toInt();
        if (element == '(') {
            where = Center;
        } else if (element == ')') {
            where = Right;
        } else {
            ButtonInfo info;
            info.element = element;
            switch (element) {
            case PseudoElement_TitleBar:
                if (!(tb->titleBarFlags & (Qt::WindowTitleHint | Qt::WindowSystemMenuHint)))
                    continue;
                break;
            case PseudoElement_TitleBarContextHelpButton:
                if (!(tb->titleBarFlags & Qt::WindowContextHelpButtonHint))
                    continue;
                break;
            case PseudoElement_TitleBarMinButton:
                if (!(tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarMaxButton:
                if (!(tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    continue;
                if (isMaximized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarShadeButton:
                if (!(tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarUnshadeButton;
                break;
            case PseudoElement_TitleBarCloseButton:
            case PseudoElement_TitleBarSysMenu:
                if (!(tb->titleBarFlags & Qt::WindowSystemMenuHint))
                    continue;
                break;
            default:
                continue;
            }
            if (info.element == PseudoElement_TitleBar) {
                info.width = tb->fontMetrics.horizontalAdvance(tb->text) + 6;
                subRule.geo = new QStyleSheetGeometryData(info.width, tb->fontMetrics.height(), -1, -1, -1, -1);
            } else {
                subRule = renderRule(w, tb, info.element);
                info.width = subRule.size().width();
            }
            info.rule = subRule;
            info.offset = offsets[where];
            info.where = where;
            offsets[where] += info.width;

            infos.append(std::move(info));
        }
    }

    for (const ButtonInfo &info : std::as_const(infos)) {
        QRect lr = cr;
        switch (info.where) {
        case Center: {
            lr.setLeft(cr.left() + offsets[Left]);
            lr.setRight(cr.right() - offsets[Right]);
            QRect r(0, 0, offsets[Center], lr.height());
            r.moveCenter(lr.center());
            r.setLeft(r.left()+info.offset);
            r.setWidth(info.width);
            lr = r;
            break; }
        case Left:
            lr.translate(info.offset, 0);
            lr.setWidth(info.width);
            break;
        case Right:
            lr.moveLeft(cr.right() + 1 - offsets[Right] + info.offset);
            lr.setWidth(info.width);
            break;
        default:
            break;
        }
        QStyle::SubControl control = knownPseudoElements[info.element].subControl;
        layoutRects[control] = positionRect(w, info.rule, info.element, lr, tb->direction);
    }

    return layoutRects;
}